

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_printf.h
# Opt level: O0

int stbsp__real_to_str(char **start,uint *len,char *out,int *decimal_pos,double value,
                      uint frac_digits)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  double dVar4;
  double dVar5;
  uint local_c8;
  int local_c4;
  char *o;
  uint n_1;
  uint n;
  unsigned_long_long r;
  uint dg;
  double t;
  double vh;
  double alo;
  double ahi;
  double pl;
  double ph;
  longlong v;
  int local_60;
  int cn;
  int tens;
  int ng;
  int e;
  int expo;
  longlong bits;
  double d;
  double dStack_38;
  uint frac_digits_local;
  double value_local;
  int *decimal_pos_local;
  char *out_local;
  uint *len_local;
  char **start_local;
  
  _e = 0;
  bits = (longlong)value;
  for (v._4_4_ = 0; v._4_4_ < 8; v._4_4_ = v._4_4_ + 1) {
    *(undefined1 *)((long)&e + (long)v._4_4_) = *(undefined1 *)((long)&bits + (long)v._4_4_);
  }
  iVar1 = (int)(_e >> 0x20);
  ng = iVar1 >> 0x14 & 0x7ff;
  cn = iVar1 >> 0x1f;
  if ((long)_e < 0) {
    bits = (longlong)-value;
  }
  if (ng == 0x7ff) {
    pcVar3 = "Inf";
    if ((_e & 0xfffffffffffff) != 0) {
      pcVar3 = "NaN";
    }
    *start = pcVar3;
    *decimal_pos = 0x7000;
    *len = 3;
    start_local._4_4_ = cn;
  }
  else {
    if (ng == 0) {
      if ((_e & 0x7fffffffffffffff) == 0) {
        *decimal_pos = 1;
        *start = out;
        *out = '0';
        *len = 1;
        return cn;
      }
      for (ph = 1.1125369292536007e-308; (_e & (ulong)ph) == 0; ph = (double)((long)ph >> 1)) {
        ng = ng + -1;
      }
    }
    iVar1 = ng + -0x3ff;
    if (iVar1 < 0) {
      local_c4 = (iVar1 * 0x269) / 0x800;
    }
    else {
      local_c4 = (iVar1 * 0x4d1) / 0x1000 + 1;
    }
    local_60 = local_c4;
    d._4_4_ = frac_digits;
    dStack_38 = value;
    value_local = (double)decimal_pos;
    decimal_pos_local = (int *)out;
    out_local = (char *)len;
    len_local = (uint *)start;
    stbsp__raise_to_power10(&pl,&ahi,(double)bits,0x12 - local_c4);
    dVar4 = (double)(long)pl;
    dVar5 = pl - dVar4;
    _e = (long)(dVar5 + ((pl - (dVar5 - (dVar5 - pl))) - (dVar4 + (dVar5 - pl))) + ahi) + (long)pl;
    if (999999999999999999 < _e) {
      local_60 = local_60 + 1;
    }
    if ((d._4_4_ & 0x80000000) == 0) {
      local_c8 = local_60 + d._4_4_;
    }
    else {
      local_c8 = (d._4_4_ & 0x7ffffff) + 1;
    }
    if (local_c8 < 0x18) {
      r._4_4_ = 1;
      if (999999999 < _e) {
        r._4_4_ = 10;
      }
      do {
        if (_e < stbsp__powten[r._4_4_]) {
          if ((local_c8 < r._4_4_) && (r._4_4_ - local_c8 < 0x18)) {
            _e = _e + (stbsp__powten[(int)(r._4_4_ - local_c8)] >> 1);
            if (stbsp__powten[r._4_4_] <= _e) {
              local_60 = local_60 + 1;
            }
            _e = _e / stbsp__powten[(int)(r._4_4_ - local_c8)];
          }
          break;
        }
        r._4_4_ = r._4_4_ + 1;
      } while (r._4_4_ != 0x14);
    }
    if (_e != 0) {
      for (; 0xffffffff < (long)_e; _e = (long)_e / 1000) {
        if ((long)_e % 1000 != 0) goto LAB_0010b65c;
      }
      for (o._4_4_ = (uint)_e; o._4_4_ % 1000 == 0; o._4_4_ = o._4_4_ / 1000) {
      }
      _e = (ulong)o._4_4_;
    }
LAB_0010b65c:
    decimal_pos_local = decimal_pos_local + 0x10;
    tens = 0;
    while( true ) {
      piVar2 = decimal_pos_local + -2;
      if ((long)_e < 100000000) {
        o._0_4_ = (uint)_e;
        _e = 0;
      }
      else {
        o._0_4_ = (uint)((long)_e % 100000000);
        _e = (long)_e / 100000000;
      }
      for (; (uint)o != 0; o._0_4_ = (uint)o / 100) {
        decimal_pos_local = (int *)((long)decimal_pos_local + -2);
        *(undefined2 *)decimal_pos_local = *(undefined2 *)(stbsp__digitpair + ((uint)o % 100 << 1));
        tens = tens + 2;
      }
      if (_e == 0) break;
      while (decimal_pos_local != piVar2) {
        *(undefined1 *)((long)decimal_pos_local + -1) = 0x30;
        tens = tens + 1;
        decimal_pos_local = (int *)((long)decimal_pos_local + -1);
      }
    }
    if ((tens != 0) && ((char)*decimal_pos_local == '0')) {
      decimal_pos_local = (int *)((long)decimal_pos_local + 1);
      tens = tens + -1;
    }
    *(int *)value_local = local_60;
    *(int **)len_local = decimal_pos_local;
    *(int *)out_local = tens;
    start_local._4_4_ = cn;
  }
  return start_local._4_4_;
}

Assistant:

static stbsp__int32 stbsp__real_to_str(char const **start, stbsp__uint32 *len, char *out, stbsp__int32 *decimal_pos, double value, stbsp__uint32 frac_digits)
{
   double d;
   stbsp__int64 bits = 0;
   stbsp__int32 expo, e, ng, tens;

   d = value;
   STBSP__COPYFP(bits, d);
   expo = (stbsp__int32)((bits >> 52) & 2047);
   ng = (stbsp__int32)(bits >> 63);
   if (ng)
      d = -d;

   if (expo == 2047) // is nan or inf?
   {
      *start = (bits & ((((stbsp__uint64)1) << 52) - 1)) ? "NaN" : "Inf";
      *decimal_pos = STBSP__SPECIAL;
      *len = 3;
      return ng;
   }

   if (expo == 0) // is zero or denormal
   {
      if ((bits << 1) == 0) // do zero
      {
         *decimal_pos = 1;
         *start = out;
         out[0] = '0';
         *len = 1;
         return ng;
      }
      // find the right expo for denormals
      {
         stbsp__int64 v = ((stbsp__uint64)1) << 51;
         while ((bits & v) == 0) {
            --expo;
            v >>= 1;
         }
      }
   }

   // find the decimal exponent as well as the decimal bits of the value
   {
      double ph, pl;

      // log10 estimate - very specifically tweaked to hit or undershoot by no more than 1 of log10 of all expos 1..2046
      tens = expo - 1023;
      tens = (tens < 0) ? ((tens * 617) / 2048) : (((tens * 1233) / 4096) + 1);

      // move the significant bits into position and stick them into an int
      stbsp__raise_to_power10(&ph, &pl, d, 18 - tens);

      // get full as much precision from double-double as possible
      stbsp__ddtoS64(bits, ph, pl);

      // check if we undershot
      if (((stbsp__uint64)bits) >= stbsp__tento19th)
         ++tens;
   }

   // now do the rounding in integer land
   frac_digits = (frac_digits & 0x80000000) ? ((frac_digits & 0x7ffffff) + 1) : (tens + frac_digits);
   if ((frac_digits < 24)) {
      stbsp__uint32 dg = 1;
      if ((stbsp__uint64)bits >= stbsp__powten[9])
         dg = 10;
      while ((stbsp__uint64)bits >= stbsp__powten[dg]) {
         ++dg;
         if (dg == 20)
            goto noround;
      }
      if (frac_digits < dg) {
         stbsp__uint64 r;
         // add 0.5 at the right position and round
         e = dg - frac_digits;
         if ((stbsp__uint32)e >= 24)
            goto noround;
         r = stbsp__powten[e];
         bits = bits + (r / 2);
         if ((stbsp__uint64)bits >= stbsp__powten[dg])
            ++tens;
         bits /= r;
      }
   noround:;
   }

   // kill long trailing runs of zeros
   if (bits) {
      stbsp__uint32 n;
      for (;;) {
         if (bits <= 0xffffffff)
            break;
         if (bits % 1000)
            goto donez;
         bits /= 1000;
      }
      n = (stbsp__uint32)bits;
      while ((n % 1000) == 0)
         n /= 1000;
      bits = n;
   donez:;
   }

   // convert to string
   out += 64;
   e = 0;
   for (;;) {
      stbsp__uint32 n;
      char *o = out - 8;
      // do the conversion in chunks of U32s (avoid most 64-bit divides, worth it, constant denomiators be damned)
      if (bits >= 100000000) {
         n = (stbsp__uint32)(bits % 100000000);
         bits /= 100000000;
      } else {
         n = (stbsp__uint32)bits;
         bits = 0;
      }
      while (n) {
         out -= 2;
         *(stbsp__uint16 *)out = *(stbsp__uint16 *)&stbsp__digitpair[(n % 100) * 2];
         n /= 100;
         e += 2;
      }
      if (bits == 0) {
         if ((e) && (out[0] == '0')) {
            ++out;
            --e;
         }
         break;
      }
      while (out != o) {
         *--out = '0';
         ++e;
      }
   }

   *decimal_pos = tens;
   *start = out;
   *len = e;
   return ng;
}